

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

int __thiscall dgrminer::PartialUnion::getDummyLabel(PartialUnion *this,int label)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Self local_28;
  iterator it;
  int label_local;
  PartialUnion *this_local;
  
  it._M_node._4_4_ = label;
  local_28._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::find
                 (&this->dummyLabelsOfLabels,(key_type *)((long)&it._M_node + 4));
  local_30._M_node =
       (_Base_ptr)
       std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                 (&this->dummyLabelsOfLabels);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->(&local_28);
    this_local._4_4_ = ppVar2->second;
  }
  else {
    this_local._4_4_ = -100;
  }
  return this_local._4_4_;
}

Assistant:

int PartialUnion::getDummyLabel(int label)
	{
		auto it = dummyLabelsOfLabels.find(label);
		if (it != dummyLabelsOfLabels.end()) {
			return it->second;
		}
		else
		{
			return -100;
		}
	}